

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MixSegment.hpp
# Opt level: O2

int __thiscall CppJieba::MixSegment::init(MixSegment *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  allocator local_29;
  string local_28;
  
  if ((this->super_SegmentBase)._isInited == true) {
    std::__cxx11::string::string((string *)&local_28,"inited.",&local_29);
    Limonp::Logger::LoggingF(3,"MixSegment.hpp",0x1d,&local_28);
  }
  else {
    iVar1 = MPSegment::init(&this->_mpSeg,ctx);
    if ((char)iVar1 == '\0') {
      std::__cxx11::string::string((string *)&local_28,"_mpSeg init",&local_29);
      Limonp::Logger::LoggingF(3,"MixSegment.hpp",0x22,&local_28);
    }
    else {
      iVar1 = HMMSegment::init(&this->_hmmSeg,ctx);
      if ((char)iVar1 != '\0') {
        (this->super_SegmentBase)._isInited = true;
        return (int)CONCAT71((uint7)(uint3)((uint)iVar1 >> 8),1);
      }
      std::__cxx11::string::string((string *)&local_28,"_hmmSeg init",&local_29);
      Limonp::Logger::LoggingF(3,"MixSegment.hpp",0x27,&local_28);
    }
  }
  std::__cxx11::string::~string((string *)&local_28);
  return 0;
}

Assistant:

virtual bool init()
            {
                if(_getInitFlag())
                {
                    LogError("inited.");
                    return false;
                }
                if(!_mpSeg.init())
                {
                    LogError("_mpSeg init");
                    return false;
                }
                if(!_hmmSeg.init())
                {
                    LogError("_hmmSeg init");
                    return false;
                }
                return _setInitFlag(true);
            }